

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

bool cppwinrt::is_add_overload(MethodDef *method)

{
  table_base *this;
  database *this_00;
  unsigned_short uVar1;
  uint index;
  int iVar2;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view local_20;
  
  uVar1 = winmd::reader::table_base::get_value<unsigned_short>
                    ((method->super_row_base<winmd::reader::MethodDef>).m_table,
                     (method->super_row_base<winmd::reader::MethodDef>).m_index,2);
  if ((uVar1 >> 0xb & 1) == 0) {
    bVar3 = false;
  }
  else {
    this = (method->super_row_base<winmd::reader::MethodDef>).m_table;
    this_00 = this->m_database;
    index = winmd::reader::table_base::get_value<unsigned_int>
                      (this,(method->super_row_base<winmd::reader::MethodDef>).m_index,3);
    local_20 = winmd::reader::database::get_string(this_00,index);
    __str._M_str = "add_";
    __str._M_len = 4;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_20,0,4,__str);
    bVar3 = iVar2 == 0;
  }
  return bVar3;
}

Assistant:

static bool is_add_overload(MethodDef const& method)
    {
        return method.SpecialName() && starts_with(method.Name(), "add_");
    }